

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_sort.cpp
# Opt level: O2

OrderByNullType duckdb::GetOrder<duckdb::OrderByNullType>(ClientContext *context,Expression *expr)

{
  char cVar1;
  OrderByNullType OVar2;
  InvalidInputException *this;
  string order_name;
  string local_80 [32];
  Value order_value;
  
  cVar1 = (**(code **)(*(long *)expr + 0x78))(expr);
  if (cVar1 != '\0') {
    duckdb::ExpressionExecutor::EvaluateScalar
              ((ClientContext *)&order_value,(Expression *)context,SUB81(expr,0));
    duckdb::Value::ToString_abi_cxx11_();
    duckdb::StringUtil::Upper((string *)&order_name);
    std::__cxx11::string::~string(local_80);
    OVar2 = duckdb::EnumUtil::FromString<duckdb::OrderByNullType>(order_name._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&order_name);
    duckdb::Value::~Value(&order_value);
    return OVar2;
  }
  this = (InvalidInputException *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string
            ((string *)&order_value,"Sorting order must be a constant",(allocator *)&order_name);
  duckdb::InvalidInputException::InvalidInputException(this,(string *)&order_value);
  __cxa_throw(this,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static T GetOrder(ClientContext &context, Expression &expr) {
	if (!expr.IsFoldable()) {
		throw InvalidInputException("Sorting order must be a constant");
	}
	Value order_value = ExpressionExecutor::EvaluateScalar(context, expr);
	auto order_name = StringUtil::Upper(order_value.ToString());
	return EnumUtil::FromString<T>(order_name.c_str());
}